

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TypeName_abi_cxx11_
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this)

{
  string *in_RDI;
  
  pzgeom::TPZGeoTriangle::TypeName_abi_cxx11_();
  return in_RDI;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }